

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_reader.cpp
# Opt level: O0

unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
duckdb::CreateDecimalReaderInternal<true>(ParquetReader *reader,ParquetColumnSchema *schema)

{
  PhysicalType PVar1;
  InternalException *this;
  long in_RDX;
  unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_> in_RDI;
  unique_ptr<duckdb::DecimalColumnReader<double,_true>,_std::default_delete<duckdb::DecimalColumnReader<double,_true>_>_>
  *in_stack_ffffffffffffff68;
  unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
  *in_stack_ffffffffffffff70;
  allocator *paVar2;
  ParquetColumnSchema *in_stack_ffffffffffffff90;
  ParquetReader *in_stack_ffffffffffffff98;
  string local_60 [96];
  
  PVar1 = LogicalType::InternalType((LogicalType *)(in_RDX + 0x28));
  if (PVar1 == INT128) {
    make_uniq<duckdb::DecimalColumnReader<duckdb::hugeint_t,true>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
    unique_ptr<duckdb::DecimalColumnReader<duckdb::hugeint_t,true>,std::default_delete<duckdb::DecimalColumnReader>,void>
              (in_stack_ffffffffffffff70,
               (unique_ptr<duckdb::DecimalColumnReader<duckdb::hugeint_t,_true>,_std::default_delete<duckdb::DecimalColumnReader<duckdb::hugeint_t,_true>_>_>
                *)in_stack_ffffffffffffff68);
    unique_ptr<duckdb::DecimalColumnReader<duckdb::hugeint_t,_true>,_std::default_delete<duckdb::DecimalColumnReader<duckdb::hugeint_t,_true>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::DecimalColumnReader<duckdb::hugeint_t,_true>,_std::default_delete<duckdb::DecimalColumnReader<duckdb::hugeint_t,_true>_>,_true>
                   *)0x85a01b);
  }
  else if (PVar1 == INT16) {
    make_uniq<duckdb::DecimalColumnReader<short,true>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
    unique_ptr<duckdb::DecimalColumnReader<short,true>,std::default_delete<duckdb::unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::unique_ptr>,void>
              (in_stack_ffffffffffffff70,
               (unique_ptr<duckdb::DecimalColumnReader<short,_true>,_std::default_delete<duckdb::DecimalColumnReader<short,_true>_>_>
                *)in_stack_ffffffffffffff68);
    unique_ptr<duckdb::DecimalColumnReader<short,_true>,_std::default_delete<duckdb::DecimalColumnReader<short,_true>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::DecimalColumnReader<short,_true>,_std::default_delete<duckdb::DecimalColumnReader<short,_true>_>,_true>
                   *)0x859f73);
  }
  else if (PVar1 == INT32) {
    make_uniq<duckdb::DecimalColumnReader<int,true>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
    unique_ptr<duckdb::DecimalColumnReader<int,true>,std::default_delete<duckdb::unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::unique_ptr>,void>
              (in_stack_ffffffffffffff70,
               (unique_ptr<duckdb::DecimalColumnReader<int,_true>,_std::default_delete<duckdb::DecimalColumnReader<int,_true>_>_>
                *)in_stack_ffffffffffffff68);
    unique_ptr<duckdb::DecimalColumnReader<int,_true>,_std::default_delete<duckdb::DecimalColumnReader<int,_true>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::DecimalColumnReader<int,_true>,_std::default_delete<duckdb::DecimalColumnReader<int,_true>_>,_true>
                   *)0x859fab);
  }
  else if (PVar1 == INT64) {
    make_uniq<duckdb::DecimalColumnReader<long,true>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
    unique_ptr<duckdb::DecimalColumnReader<long,true>,std::default_delete<duckdb::unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::unique_ptr>,void>
              (in_stack_ffffffffffffff70,
               (unique_ptr<duckdb::DecimalColumnReader<long,_true>,_std::default_delete<duckdb::DecimalColumnReader<long,_true>_>_>
                *)in_stack_ffffffffffffff68);
    unique_ptr<duckdb::DecimalColumnReader<long,_true>,_std::default_delete<duckdb::DecimalColumnReader<long,_true>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::DecimalColumnReader<long,_true>,_std::default_delete<duckdb::DecimalColumnReader<long,_true>_>,_true>
                   *)0x859fe3);
  }
  else {
    if (PVar1 != DOUBLE) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      paVar2 = (allocator *)&stack0xffffffffffffff9f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"Unrecognized type for Decimal",paVar2);
      duckdb::InternalException::InternalException(this,local_60);
      __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
    }
    make_uniq<duckdb::DecimalColumnReader<double,true>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
    unique_ptr<duckdb::DecimalColumnReader<double,true>,std::default_delete<duckdb::unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::unique_ptr>,void>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    unique_ptr<duckdb::DecimalColumnReader<double,_true>,_std::default_delete<duckdb::DecimalColumnReader<double,_true>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::DecimalColumnReader<double,_true>,_std::default_delete<duckdb::DecimalColumnReader<double,_true>_>,_true>
                   *)0x85a053);
  }
  return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
         (__uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>.
         super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ColumnReader> CreateDecimalReaderInternal(ParquetReader &reader, const ParquetColumnSchema &schema) {
	switch (schema.type.InternalType()) {
	case PhysicalType::INT16:
		return make_uniq<DecimalColumnReader<int16_t, FIXED>>(reader, schema);
	case PhysicalType::INT32:
		return make_uniq<DecimalColumnReader<int32_t, FIXED>>(reader, schema);
	case PhysicalType::INT64:
		return make_uniq<DecimalColumnReader<int64_t, FIXED>>(reader, schema);
	case PhysicalType::INT128:
		return make_uniq<DecimalColumnReader<hugeint_t, FIXED>>(reader, schema);
	case PhysicalType::DOUBLE:
		return make_uniq<DecimalColumnReader<double, FIXED>>(reader, schema);
	default:
		throw InternalException("Unrecognized type for Decimal");
	}
}